

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_sse4.c
# Opt level: O1

void av1_highbd_dist_wtd_convolve_y_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  int16_t *piVar1;
  undefined1 (*pauVar2) [16];
  ushort *puVar3;
  undefined2 *puVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  CONV_BUF_TYPE *pCVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  char cVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined2 uVar26;
  undefined2 uVar27;
  undefined2 uVar28;
  undefined2 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint16_t *puVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  long lVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  CONV_BUF_TYPE *pCVar55;
  uint16_t *puVar56;
  uint16_t *puVar57;
  int iVar58;
  long lVar59;
  int iVar60;
  CONV_BUF_TYPE *pCVar61;
  uint uVar62;
  uint16_t *puVar63;
  ulong uVar64;
  int iVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  short sVar68;
  int iVar69;
  int iVar70;
  short sVar79;
  int iVar80;
  int iVar83;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  int iVar71;
  int iVar81;
  int iVar84;
  int iVar85;
  undefined1 auVar75 [16];
  short sVar78;
  short sVar82;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int iVar86;
  int iVar91;
  int iVar92;
  undefined1 auVar87 [16];
  undefined1 auVar89 [16];
  int iVar93;
  undefined1 auVar90 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar121;
  int iVar125;
  int iVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  int iVar127;
  undefined1 auVar124 [16];
  short sVar128;
  int iVar129;
  short sVar139;
  int iVar140;
  int iVar142;
  undefined1 auVar130 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  int iVar143;
  undefined1 auVar136 [16];
  short sVar138;
  short sVar141;
  undefined1 auVar137 [16];
  undefined2 local_1f8;
  undefined2 uStack_1f6;
  undefined2 uStack_1f4;
  undefined2 uStack_1f2;
  undefined2 uStack_1f0;
  undefined2 uStack_1ee;
  undefined2 uStack_1ec;
  undefined2 uStack_1ea;
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined2 uStack_1da;
  short local_108;
  short sStack_106;
  undefined1 local_a8 [16];
  undefined1 auVar88 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar106 [16];
  undefined1 auVar103 [16];
  undefined1 auVar107 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  
  iVar58 = conv_params->round_1 + conv_params->round_0;
  cVar21 = (char)bd - (char)iVar58;
  uVar48 = 0xff;
  if (bd == 0xc) {
    uVar48 = 0xfff;
  }
  uVar62 = 0x3ff;
  if (bd != 10) {
    uVar62 = uVar48;
  }
  if (0 < w) {
    iVar60 = 7 - conv_params->round_0;
    pCVar8 = conv_params->dst;
    lVar51 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    iVar5 = conv_params->fwd_offset;
    iVar6 = conv_params->bck_offset;
    iVar65 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
    auVar66 = ZEXT416((uint)conv_params->round_1);
    iVar53 = (1 << (cVar21 + 0xdU & 0x1f)) + (1 << (cVar21 + 0xeU & 0x1f));
    uVar48 = 0xe - iVar58;
    auVar67 = pshuflw(ZEXT416(uVar62),ZEXT416(uVar62),0);
    lVar59 = (long)conv_params->dst_stride;
    piVar1 = filter_params_y->filter_ptr + (subpel_y_qn & 0xfU) * (uint)filter_params_y->taps;
    uVar22 = *(undefined4 *)piVar1;
    uVar23 = *(undefined4 *)(piVar1 + 2);
    uVar24 = *(undefined4 *)(piVar1 + 4);
    uVar25 = *(undefined4 *)(piVar1 + 6);
    iVar69 = (1 << ((byte)uVar48 & 0x1f)) >> 1;
    iVar58 = conv_params->do_average;
    iVar7 = conv_params->use_dist_wtd_comp_avg;
    lVar49 = (long)src_stride;
    iVar70 = iVar69 - iVar53;
    iVar80 = iVar69 - iVar53;
    iVar83 = iVar69 - iVar53;
    iVar69 = iVar69 - iVar53;
    lVar52 = (long)dst_stride0;
    lVar54 = 0;
    uVar64 = 0;
    do {
      if (0 < h) {
        pauVar2 = (undefined1 (*) [16])(src + (uVar64 - lVar51));
        auVar74 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 5) * 2);
        uVar30 = *(undefined8 *)(*pauVar2 + (long)(src_stride * 6) * 2);
        uVar31 = *(undefined8 *)((long)(*pauVar2 + (long)(src_stride * 6) * 2) + 8);
        local_1f8 = (undefined2)uVar30;
        uStack_1f6 = (undefined2)((ulong)uVar30 >> 0x10);
        uStack_1f4 = (undefined2)((ulong)uVar30 >> 0x20);
        uStack_1f2 = (undefined2)((ulong)uVar30 >> 0x30);
        uStack_1f0 = (undefined2)uVar31;
        uStack_1ee = (undefined2)((ulong)uVar31 >> 0x10);
        uStack_1ec = (undefined2)((ulong)uVar31 >> 0x20);
        uStack_1ea = (undefined2)((ulong)uVar31 >> 0x30);
        auVar101 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 3) * 2);
        auVar72 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 4) * 2);
        auVar96 = *(undefined1 (*) [16])(*pauVar2 + lVar49 * 2);
        auVar110 = *(undefined1 (*) [16])(*pauVar2 + (long)(src_stride * 2) * 2);
        auVar73 = *pauVar2;
        auVar109._2_2_ = auVar96._8_2_;
        auVar109._0_2_ = auVar73._8_2_;
        auVar109._4_2_ = auVar73._10_2_;
        auVar109._6_2_ = auVar96._10_2_;
        auVar109._8_2_ = auVar73._12_2_;
        auVar109._10_2_ = auVar96._12_2_;
        auVar109._12_2_ = auVar73._14_2_;
        auVar109._14_2_ = auVar96._14_2_;
        auVar134._0_12_ = auVar73._0_12_;
        auVar134._12_2_ = auVar73._6_2_;
        auVar134._14_2_ = auVar96._6_2_;
        auVar115._12_4_ = auVar134._12_4_;
        auVar115._0_10_ = auVar73._0_10_;
        auVar115._10_2_ = auVar96._4_2_;
        auVar111._10_6_ = auVar115._10_6_;
        auVar111._0_8_ = auVar73._0_8_;
        auVar111._8_2_ = auVar73._4_2_;
        auVar94._8_8_ = auVar111._8_8_;
        auVar94._6_2_ = auVar96._2_2_;
        auVar94._4_2_ = auVar73._2_2_;
        auVar94._0_2_ = auVar73._0_2_;
        auVar94._2_2_ = auVar96._0_2_;
        auVar119._2_2_ = auVar110._8_2_;
        auVar119._0_2_ = auVar96._8_2_;
        auVar119._4_2_ = auVar96._10_2_;
        auVar119._6_2_ = auVar110._10_2_;
        auVar119._8_2_ = auVar96._12_2_;
        auVar119._10_2_ = auVar110._12_2_;
        auVar119._12_2_ = auVar96._14_2_;
        auVar119._14_2_ = auVar110._14_2_;
        auVar114._0_12_ = auVar96._0_12_;
        auVar114._12_2_ = auVar96._6_2_;
        auVar114._14_2_ = auVar110._6_2_;
        auVar113._12_4_ = auVar114._12_4_;
        auVar113._0_10_ = auVar96._0_10_;
        auVar113._10_2_ = auVar110._4_2_;
        auVar112._10_6_ = auVar113._10_6_;
        auVar112._0_8_ = auVar96._0_8_;
        auVar112._8_2_ = auVar96._4_2_;
        auVar95._8_8_ = auVar112._8_8_;
        auVar95._6_2_ = auVar110._2_2_;
        auVar95._4_2_ = auVar96._2_2_;
        auVar73._0_2_ = auVar110._0_2_;
        auVar95._2_2_ = auVar73._0_2_;
        auVar95._0_2_ = auVar96._0_2_;
        local_1e8 = auVar101._8_2_;
        auVar108._2_2_ = local_1e8;
        auVar108._0_2_ = auVar110._8_2_;
        auVar108._4_2_ = auVar110._10_2_;
        uStack_1e4 = auVar101._10_2_;
        auVar108._6_2_ = uStack_1e4;
        auVar108._8_2_ = auVar110._12_2_;
        uStack_1e0 = auVar101._12_2_;
        auVar108._10_2_ = uStack_1e0;
        auVar108._12_2_ = auVar110._14_2_;
        uStack_1dc = auVar101._14_2_;
        auVar108._14_2_ = uStack_1dc;
        auVar88._0_12_ = auVar110._0_12_;
        auVar88._12_2_ = auVar110._6_2_;
        auVar88._14_2_ = auVar101._6_2_;
        auVar87._12_4_ = auVar88._12_4_;
        auVar87._0_10_ = auVar110._0_10_;
        auVar87._10_2_ = auVar101._4_2_;
        auVar100._10_6_ = auVar87._10_6_;
        auVar100._0_8_ = auVar110._0_8_;
        auVar100._8_2_ = auVar110._4_2_;
        auVar73._8_8_ = auVar100._8_8_;
        auVar73._6_2_ = auVar101._2_2_;
        auVar73._4_2_ = auVar110._2_2_;
        auVar73._2_2_ = auVar101._0_2_;
        uStack_1e6 = auVar72._8_2_;
        uStack_1e2 = auVar72._10_2_;
        uStack_1de = auVar72._12_2_;
        uStack_1da = auVar72._14_2_;
        auVar133._0_12_ = auVar101._0_12_;
        auVar133._12_2_ = auVar101._6_2_;
        auVar133._14_2_ = auVar72._6_2_;
        auVar132._12_4_ = auVar133._12_4_;
        auVar132._0_10_ = auVar101._0_10_;
        auVar132._10_2_ = auVar72._4_2_;
        auVar131._10_6_ = auVar132._10_6_;
        auVar131._0_8_ = auVar101._0_8_;
        auVar131._8_2_ = auVar101._4_2_;
        auVar130._8_8_ = auVar131._8_8_;
        auVar130._6_2_ = auVar72._2_2_;
        auVar130._4_2_ = auVar101._2_2_;
        auVar96._0_2_ = auVar72._0_2_;
        auVar130._2_2_ = auVar96._0_2_;
        auVar130._0_2_ = auVar101._0_2_;
        auVar110._2_2_ = auVar74._8_2_;
        auVar110._0_2_ = uStack_1e6;
        auVar110._4_2_ = uStack_1e2;
        auVar110._6_2_ = auVar74._10_2_;
        auVar110._8_2_ = uStack_1de;
        auVar110._10_2_ = auVar74._12_2_;
        auVar110._12_2_ = uStack_1da;
        auVar110._14_2_ = auVar74._14_2_;
        auVar99._0_12_ = auVar72._0_12_;
        auVar99._12_2_ = auVar72._6_2_;
        auVar99._14_2_ = auVar74._6_2_;
        auVar98._12_4_ = auVar99._12_4_;
        auVar98._0_10_ = auVar72._0_10_;
        auVar98._10_2_ = auVar74._4_2_;
        auVar97._10_6_ = auVar98._10_6_;
        auVar97._0_8_ = auVar72._0_8_;
        auVar97._8_2_ = auVar72._4_2_;
        auVar96._8_8_ = auVar97._8_8_;
        auVar96._6_2_ = auVar74._2_2_;
        auVar96._4_2_ = auVar72._2_2_;
        auVar96._2_2_ = auVar74._0_2_;
        local_a8._2_2_ = uStack_1f0;
        local_a8._0_2_ = auVar74._8_2_;
        local_a8._4_2_ = auVar74._10_2_;
        local_a8._6_2_ = uStack_1ee;
        local_a8._8_2_ = auVar74._12_2_;
        local_a8._10_2_ = uStack_1ec;
        local_a8._12_2_ = auVar74._14_2_;
        local_a8._14_2_ = uStack_1ea;
        auVar103._0_12_ = auVar74._0_12_;
        auVar103._12_2_ = auVar74._6_2_;
        auVar103._14_2_ = uStack_1f2;
        auVar102._12_4_ = auVar103._12_4_;
        auVar102._0_10_ = auVar74._0_10_;
        auVar102._10_2_ = uStack_1f4;
        auVar72._10_6_ = auVar102._10_6_;
        auVar72._0_8_ = auVar74._0_8_;
        auVar72._8_2_ = auVar74._4_2_;
        auVar101._8_8_ = auVar72._8_8_;
        auVar101._6_2_ = uStack_1f6;
        auVar101._4_2_ = auVar74._2_2_;
        auVar101._2_2_ = local_1f8;
        auVar101._0_2_ = auVar74._0_2_;
        lVar50 = 0;
        puVar47 = src + (src_stride * 7 - lVar51);
        pCVar55 = pCVar8 + lVar59;
        puVar56 = dst0;
        puVar57 = dst0 + lVar52;
        pCVar61 = pCVar8;
        puVar63 = src + (src_stride * 8 - lVar51);
        do {
          auVar88 = auVar108;
          auVar87 = auVar101;
          auVar108 = auVar73;
          uVar30 = CONCAT26(uStack_1e2,CONCAT24(uStack_1e4,CONCAT22(uStack_1e6,local_1e8)));
          uVar31 = CONCAT26(uStack_1da,CONCAT24(uStack_1dc,CONCAT22(uStack_1de,uStack_1e0)));
          local_1e8 = local_a8._0_2_;
          uStack_1e6 = local_a8._2_2_;
          uStack_1e4 = local_a8._4_2_;
          uStack_1e2 = local_a8._6_2_;
          uStack_1e0 = local_a8._8_2_;
          uStack_1de = local_a8._10_2_;
          uStack_1dc = local_a8._12_2_;
          uStack_1da = local_a8._14_2_;
          auVar74 = *(undefined1 (*) [16])((long)puVar47 + lVar54);
          auVar104._8_8_ =
               (undefined8)
               (CONCAT64(CONCAT42(CONCAT22(auVar74._6_2_,uStack_1f2),auVar74._4_2_),
                         CONCAT22(uStack_1f4,uStack_1f2)) >> 0x10);
          auVar104._6_2_ = auVar74._2_2_;
          auVar104._4_2_ = uStack_1f6;
          auVar104._2_2_ = auVar74._0_2_;
          auVar104._0_2_ = local_1f8;
          auVar46._4_4_ = uVar22;
          auVar46._0_4_ = uVar22;
          auVar46._8_4_ = uVar22;
          auVar46._12_4_ = uVar22;
          auVar72 = pmaddwd(auVar94,auVar46);
          auVar13._4_4_ = uVar23;
          auVar13._0_4_ = uVar23;
          auVar13._8_4_ = uVar23;
          auVar13._12_4_ = uVar23;
          auVar94 = pmaddwd(auVar108,auVar13);
          auVar17._4_4_ = uVar24;
          auVar17._0_4_ = uVar24;
          auVar17._8_4_ = uVar24;
          auVar17._12_4_ = uVar24;
          auVar100 = pmaddwd(auVar96,auVar17);
          auVar9._4_4_ = uVar25;
          auVar9._0_4_ = uVar25;
          auVar9._8_4_ = uVar25;
          auVar9._12_4_ = uVar25;
          auVar73 = pmaddwd(auVar104,auVar9);
          auVar115 = pmaddwd(auVar95,auVar46);
          auVar14._4_4_ = uVar23;
          auVar14._0_4_ = uVar23;
          auVar14._8_4_ = uVar23;
          auVar14._12_4_ = uVar23;
          auVar95 = pmaddwd(auVar130,auVar14);
          auVar18._4_4_ = uVar24;
          auVar18._0_4_ = uVar24;
          auVar18._8_4_ = uVar24;
          auVar18._12_4_ = uVar24;
          auVar111 = pmaddwd(auVar87,auVar18);
          puVar4 = (undefined2 *)((long)puVar63 + lVar54);
          local_1f8 = *puVar4;
          uStack_1f6 = puVar4[1];
          uStack_1f4 = puVar4[2];
          uStack_1f2 = puVar4[3];
          uVar26 = puVar4[4];
          uVar27 = puVar4[5];
          uVar28 = puVar4[6];
          uVar29 = puVar4[7];
          auVar107._0_12_ = auVar74._0_12_;
          auVar107._12_2_ = auVar74._6_2_;
          auVar107._14_2_ = uStack_1f2;
          auVar106._12_4_ = auVar107._12_4_;
          auVar106._0_10_ = auVar74._0_10_;
          auVar106._10_2_ = uStack_1f4;
          auVar105._10_6_ = auVar106._10_6_;
          auVar105._0_8_ = auVar74._0_8_;
          auVar105._8_2_ = auVar74._4_2_;
          auVar101._8_8_ = auVar105._8_8_;
          auVar101._6_2_ = uStack_1f6;
          auVar101._4_2_ = auVar74._2_2_;
          auVar101._2_2_ = local_1f8;
          auVar101._0_2_ = auVar74._0_2_;
          auVar10._4_4_ = uVar25;
          auVar10._0_4_ = uVar25;
          auVar10._8_4_ = uVar25;
          auVar10._12_4_ = uVar25;
          auVar134 = pmaddwd(auVar101,auVar10);
          auVar122._2_2_ = auVar74._8_2_;
          auVar122._0_2_ = uStack_1f0;
          auVar122._4_2_ = uStack_1ee;
          auVar122._6_2_ = auVar74._10_2_;
          auVar122._8_2_ = uStack_1ec;
          auVar122._10_2_ = auVar74._12_2_;
          auVar122._12_2_ = uStack_1ea;
          auVar122._14_2_ = auVar74._14_2_;
          auVar120._2_2_ = uVar26;
          auVar120._0_2_ = auVar74._8_2_;
          auVar120._4_2_ = auVar74._10_2_;
          auVar120._6_2_ = uVar27;
          auVar120._8_2_ = auVar74._12_2_;
          auVar120._10_2_ = uVar28;
          auVar120._12_2_ = auVar74._14_2_;
          auVar120._14_2_ = uVar29;
          auVar74._0_4_ =
               ((auVar73._0_4_ + auVar100._0_4_ + auVar94._0_4_ + auVar72._0_4_ << iVar60) + iVar65
               >> auVar66) + iVar53;
          auVar74._4_4_ =
               (auVar73._4_4_ + auVar100._4_4_ + auVar94._4_4_ + auVar72._4_4_ + iVar65 >> auVar66)
               + iVar53;
          auVar74._8_4_ =
               (auVar73._8_4_ + auVar100._8_4_ + auVar94._8_4_ + auVar72._8_4_ + iVar65 >> auVar66)
               + iVar53;
          auVar74._12_4_ =
               (auVar73._12_4_ + auVar100._12_4_ + auVar94._12_4_ + auVar72._12_4_ + iVar65 >>
               auVar66) + iVar53;
          auVar135._0_4_ =
               ((auVar134._0_4_ + auVar111._0_4_ + auVar95._0_4_ + auVar115._0_4_ << iVar60) +
                iVar65 >> auVar66) + iVar53;
          auVar135._4_4_ =
               (auVar134._4_4_ + auVar111._4_4_ + auVar95._4_4_ + auVar115._4_4_ + iVar65 >> auVar66
               ) + iVar53;
          auVar135._8_4_ =
               (auVar134._8_4_ + auVar111._8_4_ + auVar95._8_4_ + auVar115._8_4_ + iVar65 >> auVar66
               ) + iVar53;
          auVar135._12_4_ =
               (auVar134._12_4_ + auVar111._12_4_ + auVar95._12_4_ + auVar115._12_4_ + iVar65 >>
               auVar66) + iVar53;
          local_108 = auVar67._0_2_;
          sStack_106 = auVar67._2_2_;
          if ((long)((ulong)(uint)w - 8) < (long)uVar64) {
            if (iVar58 == 0) {
              auVar74 = packusdw(auVar74,auVar74);
              auVar72 = packusdw(auVar135,auVar135);
              *(long *)((long)pCVar61 + lVar54) = auVar74._0_8_;
              *(long *)((long)pCVar55 + lVar54) = auVar72._0_8_;
            }
            else {
              auVar72 = pmovzxwd(auVar46,*(undefined8 *)((long)pCVar61 + lVar54));
              if (iVar7 == 0) {
                iVar71 = auVar74._0_4_ + auVar72._0_4_ >> 1;
                iVar81 = auVar74._4_4_ + auVar72._4_4_ >> 1;
                iVar84 = auVar74._8_4_ + auVar72._8_4_ >> 1;
                iVar85 = auVar74._12_4_ + auVar72._12_4_ >> 1;
              }
              else {
                auVar38._4_4_ = iVar5;
                auVar38._0_4_ = iVar5;
                auVar38._8_4_ = iVar5;
                auVar38._12_4_ = iVar5;
                auVar72 = pmulld(auVar72,auVar38);
                auVar32._4_4_ = iVar6;
                auVar32._0_4_ = iVar6;
                auVar32._8_4_ = iVar6;
                auVar32._12_4_ = iVar6;
                auVar74 = pmulld(auVar74,auVar32);
                iVar71 = auVar74._0_4_ + auVar72._0_4_ >> 4;
                iVar81 = auVar74._4_4_ + auVar72._4_4_ >> 4;
                iVar84 = auVar74._8_4_ + auVar72._8_4_ >> 4;
                iVar85 = auVar74._12_4_ + auVar72._12_4_ >> 4;
              }
              auVar74 = pmovzxwd(auVar72,*(undefined8 *)((long)pCVar55 + lVar54));
              if (iVar7 == 0) {
                iVar129 = auVar135._0_4_ + auVar74._0_4_ >> 1;
                iVar140 = auVar135._4_4_ + auVar74._4_4_ >> 1;
                iVar142 = auVar135._8_4_ + auVar74._8_4_ >> 1;
                iVar143 = auVar135._12_4_ + auVar74._12_4_ >> 1;
              }
              else {
                auVar40._4_4_ = iVar5;
                auVar40._0_4_ = iVar5;
                auVar40._8_4_ = iVar5;
                auVar40._12_4_ = iVar5;
                auVar74 = pmulld(auVar74,auVar40);
                auVar34._4_4_ = iVar6;
                auVar34._0_4_ = iVar6;
                auVar34._8_4_ = iVar6;
                auVar34._12_4_ = iVar6;
                auVar72 = pmulld(auVar135,auVar34);
                iVar129 = auVar72._0_4_ + auVar74._0_4_ >> 4;
                iVar140 = auVar72._4_4_ + auVar74._4_4_ >> 4;
                iVar142 = auVar72._8_4_ + auVar74._8_4_ >> 4;
                iVar143 = auVar72._12_4_ + auVar74._12_4_ >> 4;
              }
              auVar74 = ZEXT416(uVar48);
              auVar75._0_4_ = iVar71 + iVar70 >> auVar74;
              auVar75._4_4_ = iVar81 + iVar80 >> auVar74;
              auVar75._8_4_ = iVar84 + iVar83 >> auVar74;
              auVar75._12_4_ = iVar85 + iVar69 >> auVar74;
              auVar136._0_4_ = iVar129 + iVar70 >> auVar74;
              auVar136._4_4_ = iVar140 + iVar80 >> auVar74;
              auVar136._8_4_ = iVar142 + iVar83 >> auVar74;
              auVar136._12_4_ = iVar143 + iVar69 >> auVar74;
              auVar74 = packusdw(auVar75,auVar75);
              sVar68 = auVar74._0_2_;
              sVar78 = auVar74._2_2_;
              sVar79 = auVar74._4_2_;
              sVar82 = auVar74._6_2_;
              auVar74 = packusdw(auVar136,auVar136);
              sVar128 = auVar74._0_2_;
              sVar138 = auVar74._2_2_;
              sVar139 = auVar74._4_2_;
              sVar141 = auVar74._6_2_;
              *(ulong *)((long)puVar56 + lVar54) =
                   CONCAT26((ushort)(sStack_106 < sVar82) * sStack_106 |
                            (ushort)(sStack_106 >= sVar82) * sVar82,
                            CONCAT24((ushort)(local_108 < sVar79) * local_108 |
                                     (ushort)(local_108 >= sVar79) * sVar79,
                                     CONCAT22((ushort)(sStack_106 < sVar78) * sStack_106 |
                                              (ushort)(sStack_106 >= sVar78) * sVar78,
                                              (ushort)(local_108 < sVar68) * local_108 |
                                              (ushort)(local_108 >= sVar68) * sVar68)));
              *(ulong *)((long)puVar57 + lVar54) =
                   CONCAT26((ushort)(sStack_106 < sVar141) * sStack_106 |
                            (ushort)(sStack_106 >= sVar141) * sVar141,
                            CONCAT24((ushort)(local_108 < sVar139) * local_108 |
                                     (ushort)(local_108 >= sVar139) * sVar139,
                                     CONCAT22((ushort)(sStack_106 < sVar138) * sStack_106 |
                                              (ushort)(sStack_106 >= sVar138) * sVar138,
                                              (ushort)(local_108 < sVar128) * local_108 |
                                              (ushort)(local_108 >= sVar128) * sVar128)));
            }
          }
          else {
            auVar94 = pmaddwd(auVar109,auVar46);
            auVar15._4_4_ = uVar23;
            auVar15._0_4_ = uVar23;
            auVar15._8_4_ = uVar23;
            auVar15._12_4_ = uVar23;
            auVar109 = pmaddwd(auVar88,auVar15);
            auVar19._4_4_ = uVar24;
            auVar19._0_4_ = uVar24;
            auVar19._8_4_ = uVar24;
            auVar19._12_4_ = uVar24;
            auVar72 = pmaddwd(auVar110,auVar19);
            auVar11._4_4_ = uVar25;
            auVar11._0_4_ = uVar25;
            auVar11._8_4_ = uVar25;
            auVar11._12_4_ = uVar25;
            auVar111 = pmaddwd(auVar122,auVar11);
            auVar73 = pmaddwd(auVar119,auVar46);
            auVar45._8_8_ = uVar31;
            auVar45._0_8_ = uVar30;
            auVar16._4_4_ = uVar23;
            auVar16._0_4_ = uVar23;
            auVar16._8_4_ = uVar23;
            auVar16._12_4_ = uVar23;
            auVar95 = pmaddwd(auVar45,auVar16);
            auVar20._4_4_ = uVar24;
            auVar20._0_4_ = uVar24;
            auVar20._8_4_ = uVar24;
            auVar20._12_4_ = uVar24;
            auVar100 = pmaddwd(local_a8,auVar20);
            auVar116._0_4_ = auVar100._0_4_ + auVar95._0_4_ + auVar73._0_4_;
            auVar116._4_4_ = auVar100._4_4_ + auVar95._4_4_ + auVar73._4_4_;
            auVar116._8_4_ = auVar100._8_4_ + auVar95._8_4_ + auVar73._8_4_;
            auVar116._12_4_ = auVar100._12_4_ + auVar95._12_4_ + auVar73._12_4_;
            auVar12._4_4_ = uVar25;
            auVar12._0_4_ = uVar25;
            auVar12._8_4_ = uVar25;
            auVar12._12_4_ = uVar25;
            auVar73 = pmaddwd(auVar120,auVar12);
            auVar44._4_4_ = iVar53;
            auVar44._0_4_ = iVar53;
            auVar44._8_4_ = iVar53;
            auVar44._12_4_ = iVar53;
            auVar123._0_4_ =
                 ((auVar111._0_4_ + auVar72._0_4_ + auVar109._0_4_ + auVar94._0_4_ << iVar60) +
                  iVar65 >> auVar66) + iVar53;
            auVar123._4_4_ =
                 (auVar111._4_4_ + auVar72._4_4_ + auVar109._4_4_ + auVar94._4_4_ + iVar65 >>
                 auVar66) + iVar53;
            auVar123._8_4_ =
                 (auVar111._8_4_ + auVar72._8_4_ + auVar109._8_4_ + auVar94._8_4_ + iVar65 >>
                 auVar66) + iVar53;
            auVar123._12_4_ =
                 (auVar111._12_4_ + auVar72._12_4_ + auVar109._12_4_ + auVar94._12_4_ + iVar65 >>
                 auVar66) + iVar53;
            auVar89._0_4_ =
                 ((auVar73._0_4_ + auVar116._0_4_ << iVar60) + iVar65 >> auVar66) + iVar53;
            auVar89._4_4_ = (auVar73._4_4_ + auVar116._4_4_ + iVar65 >> auVar66) + iVar53;
            auVar89._8_4_ = (auVar73._8_4_ + auVar116._8_4_ + iVar65 >> auVar66) + iVar53;
            auVar89._12_4_ = (auVar73._12_4_ + auVar116._12_4_ + iVar65 >> auVar66) + iVar53;
            if (iVar58 == 0) {
              auVar74 = packusdw(auVar74,auVar123);
              auVar72 = packusdw(auVar135,auVar89);
              *(undefined1 (*) [16])((long)pCVar61 + lVar54) = auVar74;
              *(undefined1 (*) [16])((long)pCVar55 + lVar54) = auVar72;
            }
            else {
              auVar72 = *(undefined1 (*) [16])((long)pCVar61 + lVar54);
              auVar73 = pmovzxwd(auVar116,auVar72);
              if (iVar7 == 0) {
                iVar71 = auVar74._0_4_ + auVar73._0_4_ >> 1;
                iVar81 = auVar74._4_4_ + auVar73._4_4_ >> 1;
                iVar84 = auVar74._8_4_ + auVar73._8_4_ >> 1;
                iVar85 = auVar74._12_4_ + auVar73._12_4_ >> 1;
              }
              else {
                auVar39._4_4_ = iVar5;
                auVar39._0_4_ = iVar5;
                auVar39._8_4_ = iVar5;
                auVar39._12_4_ = iVar5;
                auVar73 = pmulld(auVar73,auVar39);
                auVar33._4_4_ = iVar6;
                auVar33._0_4_ = iVar6;
                auVar33._8_4_ = iVar6;
                auVar33._12_4_ = iVar6;
                auVar74 = pmulld(auVar74,auVar33);
                iVar71 = auVar74._0_4_ + auVar73._0_4_ >> 4;
                iVar81 = auVar74._4_4_ + auVar73._4_4_ >> 4;
                iVar84 = auVar74._8_4_ + auVar73._8_4_ >> 4;
                iVar85 = auVar74._12_4_ + auVar73._12_4_ >> 4;
              }
              auVar74 = *(undefined1 (*) [16])((long)pCVar55 + lVar54);
              auVar73 = pmovzxwd(auVar44,auVar74);
              if (iVar7 == 0) {
                iVar129 = auVar135._0_4_ + auVar73._0_4_ >> 1;
                iVar140 = auVar135._4_4_ + auVar73._4_4_ >> 1;
                iVar142 = auVar135._8_4_ + auVar73._8_4_ >> 1;
                iVar143 = auVar135._12_4_ + auVar73._12_4_ >> 1;
              }
              else {
                auVar41._4_4_ = iVar5;
                auVar41._0_4_ = iVar5;
                auVar41._8_4_ = iVar5;
                auVar41._12_4_ = iVar5;
                auVar73 = pmulld(auVar73,auVar41);
                auVar35._4_4_ = iVar6;
                auVar35._0_4_ = iVar6;
                auVar35._8_4_ = iVar6;
                auVar35._12_4_ = iVar6;
                auVar94 = pmulld(auVar135,auVar35);
                iVar129 = auVar94._0_4_ + auVar73._0_4_ >> 4;
                iVar140 = auVar94._4_4_ + auVar73._4_4_ >> 4;
                iVar142 = auVar94._8_4_ + auVar73._8_4_ >> 4;
                iVar143 = auVar94._12_4_ + auVar73._12_4_ >> 4;
              }
              auVar118._0_4_ = CONCAT22(0,auVar72._8_2_);
              auVar118._4_2_ = auVar72._10_2_;
              auVar118._6_2_ = 0;
              auVar118._8_2_ = auVar72._12_2_;
              auVar118._10_2_ = 0;
              auVar118._12_2_ = auVar72._14_2_;
              auVar118._14_2_ = 0;
              if (iVar7 == 0) {
                iVar121 = (int)(auVar123._0_4_ + auVar118._0_4_) >> 1;
                iVar125 = (int)(auVar123._4_4_ + (uint)auVar72._10_2_) >> 1;
                iVar126 = (int)(auVar123._8_4_ + (uint)auVar72._12_2_) >> 1;
                iVar127 = (int)(auVar123._12_4_ + (uint)auVar72._14_2_) >> 1;
              }
              else {
                auVar42._4_4_ = iVar5;
                auVar42._0_4_ = iVar5;
                auVar42._8_4_ = iVar5;
                auVar42._12_4_ = iVar5;
                auVar72 = pmulld(auVar118,auVar42);
                auVar36._4_4_ = iVar6;
                auVar36._0_4_ = iVar6;
                auVar36._8_4_ = iVar6;
                auVar36._12_4_ = iVar6;
                auVar73 = pmulld(auVar123,auVar36);
                iVar121 = auVar73._0_4_ + auVar72._0_4_ >> 4;
                iVar125 = auVar73._4_4_ + auVar72._4_4_ >> 4;
                iVar126 = auVar73._8_4_ + auVar72._8_4_ >> 4;
                iVar127 = auVar73._12_4_ + auVar72._12_4_ >> 4;
              }
              auVar117._0_4_ = CONCAT22(0,auVar74._8_2_);
              auVar117._4_2_ = auVar74._10_2_;
              auVar117._6_2_ = 0;
              auVar117._8_2_ = auVar74._12_2_;
              auVar117._10_2_ = 0;
              auVar117._12_2_ = auVar74._14_2_;
              auVar117._14_2_ = 0;
              if (iVar7 == 0) {
                iVar86 = (int)(auVar89._0_4_ + auVar117._0_4_) >> 1;
                iVar91 = (int)(auVar89._4_4_ + (uint)auVar74._10_2_) >> 1;
                iVar92 = (int)(auVar89._8_4_ + (uint)auVar74._12_2_) >> 1;
                iVar93 = (int)(auVar89._12_4_ + (uint)auVar74._14_2_) >> 1;
              }
              else {
                auVar43._4_4_ = iVar5;
                auVar43._0_4_ = iVar5;
                auVar43._8_4_ = iVar5;
                auVar43._12_4_ = iVar5;
                auVar72 = pmulld(auVar117,auVar43);
                auVar37._4_4_ = iVar6;
                auVar37._0_4_ = iVar6;
                auVar37._8_4_ = iVar6;
                auVar37._12_4_ = iVar6;
                auVar74 = pmulld(auVar89,auVar37);
                iVar86 = auVar74._0_4_ + auVar72._0_4_ >> 4;
                iVar91 = auVar74._4_4_ + auVar72._4_4_ >> 4;
                iVar92 = auVar74._8_4_ + auVar72._8_4_ >> 4;
                iVar93 = auVar74._12_4_ + auVar72._12_4_ >> 4;
              }
              auVar72 = ZEXT416(uVar48);
              auVar76._0_4_ = iVar71 + iVar70 >> auVar72;
              auVar76._4_4_ = iVar81 + iVar80 >> auVar72;
              auVar76._8_4_ = iVar84 + iVar83 >> auVar72;
              auVar76._12_4_ = iVar85 + iVar69 >> auVar72;
              auVar137._0_4_ = iVar129 + iVar70 >> auVar72;
              auVar137._4_4_ = iVar140 + iVar80 >> auVar72;
              auVar137._8_4_ = iVar142 + iVar83 >> auVar72;
              auVar137._12_4_ = iVar143 + iVar69 >> auVar72;
              auVar124._0_4_ = iVar121 + iVar70 >> auVar72;
              auVar124._4_4_ = iVar125 + iVar80 >> auVar72;
              auVar124._8_4_ = iVar126 + iVar83 >> auVar72;
              auVar124._12_4_ = iVar127 + iVar69 >> auVar72;
              auVar74 = packusdw(auVar76,auVar124);
              auVar90._0_4_ = iVar86 + iVar70 >> auVar72;
              auVar90._4_4_ = iVar91 + iVar80 >> auVar72;
              auVar90._8_4_ = iVar92 + iVar83 >> auVar72;
              auVar90._12_4_ = iVar93 + iVar69 >> auVar72;
              auVar72 = packusdw(auVar137,auVar90);
              sVar68 = auVar74._0_2_;
              auVar77._0_2_ =
                   (ushort)(local_108 < sVar68) * local_108 | (ushort)(local_108 >= sVar68) * sVar68
              ;
              sVar68 = auVar74._2_2_;
              auVar77._2_2_ =
                   (ushort)(sStack_106 < sVar68) * sStack_106 |
                   (ushort)(sStack_106 >= sVar68) * sVar68;
              sVar68 = auVar74._4_2_;
              auVar77._4_2_ =
                   (ushort)(local_108 < sVar68) * local_108 | (ushort)(local_108 >= sVar68) * sVar68
              ;
              sVar68 = auVar74._6_2_;
              auVar77._6_2_ =
                   (ushort)(sStack_106 < sVar68) * sStack_106 |
                   (ushort)(sStack_106 >= sVar68) * sVar68;
              sVar68 = auVar74._8_2_;
              auVar77._8_2_ =
                   (ushort)(local_108 < sVar68) * local_108 | (ushort)(local_108 >= sVar68) * sVar68
              ;
              sVar68 = auVar74._10_2_;
              auVar77._10_2_ =
                   (ushort)(sStack_106 < sVar68) * sStack_106 |
                   (ushort)(sStack_106 >= sVar68) * sVar68;
              sVar68 = auVar74._12_2_;
              sVar78 = auVar74._14_2_;
              auVar77._12_2_ =
                   (ushort)(local_108 < sVar68) * local_108 | (ushort)(local_108 >= sVar68) * sVar68
              ;
              auVar77._14_2_ =
                   (ushort)(sStack_106 < sVar78) * sStack_106 |
                   (ushort)(sStack_106 >= sVar78) * sVar78;
              sVar68 = auVar72._0_2_;
              sVar78 = auVar72._2_2_;
              sVar79 = auVar72._4_2_;
              sVar82 = auVar72._6_2_;
              sVar128 = auVar72._8_2_;
              sVar138 = auVar72._10_2_;
              sVar139 = auVar72._12_2_;
              sVar141 = auVar72._14_2_;
              *(undefined1 (*) [16])((long)puVar56 + lVar54) = auVar77;
              puVar3 = (ushort *)((long)puVar57 + lVar54);
              *puVar3 = (ushort)(local_108 < sVar68) * local_108 |
                        (ushort)(local_108 >= sVar68) * sVar68;
              puVar3[1] = (ushort)(sStack_106 < sVar78) * sStack_106 |
                          (ushort)(sStack_106 >= sVar78) * sVar78;
              puVar3[2] = (ushort)(local_108 < sVar79) * local_108 |
                          (ushort)(local_108 >= sVar79) * sVar79;
              puVar3[3] = (ushort)(sStack_106 < sVar82) * sStack_106 |
                          (ushort)(sStack_106 >= sVar82) * sVar82;
              puVar3[4] = (ushort)(local_108 < sVar128) * local_108 |
                          (ushort)(local_108 >= sVar128) * sVar128;
              puVar3[5] = (ushort)(sStack_106 < sVar138) * sStack_106 |
                          (ushort)(sStack_106 >= sVar138) * sVar138;
              puVar3[6] = (ushort)(local_108 < sVar139) * local_108 |
                          (ushort)(local_108 >= sVar139) * sVar139;
              puVar3[7] = (ushort)(sStack_106 < sVar141) * sStack_106 |
                          (ushort)(sStack_106 >= sVar141) * sVar141;
            }
          }
          auVar119._8_8_ = uVar31;
          auVar119._0_8_ = uVar30;
          lVar50 = lVar50 + 2;
          pCVar55 = pCVar55 + lVar59 * 2;
          pCVar61 = pCVar61 + lVar59 * 2;
          puVar57 = puVar57 + lVar52 * 2;
          puVar56 = puVar56 + lVar52 * 2;
          puVar63 = puVar63 + lVar49 * 2;
          puVar47 = puVar47 + lVar49 * 2;
          auVar73 = auVar96;
          auVar94 = auVar108;
          auVar96 = auVar104;
          auVar108 = auVar110;
          auVar110 = auVar122;
          auVar95 = auVar130;
          auVar109 = auVar88;
          auVar130 = auVar87;
          uStack_1f0 = uVar26;
          uStack_1ee = uVar27;
          uStack_1ec = uVar28;
          uStack_1ea = uVar29;
          local_a8 = auVar120;
        } while (lVar50 < h);
      }
      uVar64 = uVar64 + 8;
      lVar54 = lVar54 + 0x10;
    } while (uVar64 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_sse4_1(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m128i wt0 = _mm_set1_epi32(w0);
  const __m128i wt1 = _mm_set1_epi32(w1);
  const __m128i round_const_y =
      _mm_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m128i offset_const = _mm_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m128i rounding_const = _mm_set1_epi32((1 << rounding_shift) >> 1);
  const __m128i clip_pixel_to_bd =
      _mm_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m128i zero = _mm_setzero_si128();
  __m128i s[16], coeffs_y[4];

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m128i s0 = _mm_loadu_si128((__m128i *)(data + 0 * src_stride));
      __m128i s1 = _mm_loadu_si128((__m128i *)(data + 1 * src_stride));
      __m128i s2 = _mm_loadu_si128((__m128i *)(data + 2 * src_stride));
      __m128i s3 = _mm_loadu_si128((__m128i *)(data + 3 * src_stride));
      __m128i s4 = _mm_loadu_si128((__m128i *)(data + 4 * src_stride));
      __m128i s5 = _mm_loadu_si128((__m128i *)(data + 5 * src_stride));
      __m128i s6 = _mm_loadu_si128((__m128i *)(data + 6 * src_stride));

      s[0] = _mm_unpacklo_epi16(s0, s1);
      s[1] = _mm_unpacklo_epi16(s2, s3);
      s[2] = _mm_unpacklo_epi16(s4, s5);

      s[4] = _mm_unpackhi_epi16(s0, s1);
      s[5] = _mm_unpackhi_epi16(s2, s3);
      s[6] = _mm_unpackhi_epi16(s4, s5);

      s[0 + 8] = _mm_unpacklo_epi16(s1, s2);
      s[1 + 8] = _mm_unpacklo_epi16(s3, s4);
      s[2 + 8] = _mm_unpacklo_epi16(s5, s6);

      s[4 + 8] = _mm_unpackhi_epi16(s1, s2);
      s[5 + 8] = _mm_unpackhi_epi16(s3, s4);
      s[6 + 8] = _mm_unpackhi_epi16(s5, s6);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        __m128i s7 = _mm_loadu_si128((__m128i *)(data + 7 * src_stride));
        __m128i s8 = _mm_loadu_si128((__m128i *)(data + 8 * src_stride));

        s[3] = _mm_unpacklo_epi16(s6, s7);
        s[7] = _mm_unpackhi_epi16(s6, s7);

        s[3 + 8] = _mm_unpacklo_epi16(s7, s8);
        s[7 + 8] = _mm_unpackhi_epi16(s7, s8);

        const __m128i res_a0 = convolve(s, coeffs_y);
        __m128i res_a_round0 = _mm_sll_epi32(res_a0, round_shift_bits);
        res_a_round0 = _mm_sra_epi32(_mm_add_epi32(res_a_round0, round_const_y),
                                     round_shift_y);

        const __m128i res_a1 = convolve(s + 8, coeffs_y);
        __m128i res_a_round1 = _mm_sll_epi32(res_a1, round_shift_bits);
        res_a_round1 = _mm_sra_epi32(_mm_add_epi32(res_a_round1, round_const_y),
                                     round_shift_y);

        __m128i res_unsigned_lo_0 = _mm_add_epi32(res_a_round0, offset_const);
        __m128i res_unsigned_lo_1 = _mm_add_epi32(res_a_round1, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m128i data_0 =
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));

            const __m128i data_ref_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i comp_avg_res_0 =
                highbd_comp_avg_sse4_1(&data_ref_0, &res_unsigned_lo_0, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_1 =
                highbd_comp_avg_sse4_1(&data_ref_1, &res_unsigned_lo_1, &wt0,
                                       &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_0, round_result_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);
            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_1, round_result_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]),
                             res_clip_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);

          } else {
            __m128i res_16b_0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_lo_0);

            __m128i res_16b_1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_lo_1);

            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j], res_16b_0);
            _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                             res_16b_1);
          }
        } else {
          const __m128i res_b0 = convolve(s + 4, coeffs_y);
          __m128i res_b_round0 = _mm_sll_epi32(res_b0, round_shift_bits);
          res_b_round0 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round0, round_const_y), round_shift_y);

          const __m128i res_b1 = convolve(s + 4 + 8, coeffs_y);
          __m128i res_b_round1 = _mm_sll_epi32(res_b1, round_shift_bits);
          res_b_round1 = _mm_sra_epi32(
              _mm_add_epi32(res_b_round1, round_const_y), round_shift_y);

          __m128i res_unsigned_hi_0 = _mm_add_epi32(res_b_round0, offset_const);
          __m128i res_unsigned_hi_1 = _mm_add_epi32(res_b_round1, offset_const);

          if (do_average) {
            const __m128i data_0 =
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j]));
            const __m128i data_1 = _mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride]));
            const __m128i data_ref_0_lo_0 = _mm_unpacklo_epi16(data_0, zero);
            const __m128i data_ref_0_lo_1 = _mm_unpacklo_epi16(data_1, zero);

            const __m128i data_ref_0_hi_0 = _mm_unpackhi_epi16(data_0, zero);
            const __m128i data_ref_0_hi_1 = _mm_unpackhi_epi16(data_1, zero);

            const __m128i comp_avg_res_lo_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_0, &res_unsigned_lo_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_lo_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_lo_1, &res_unsigned_lo_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_0 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_0, &res_unsigned_hi_0,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);
            const __m128i comp_avg_res_hi_1 =
                highbd_comp_avg_sse4_1(&data_ref_0_hi_1, &res_unsigned_hi_1,
                                       &wt0, &wt1, use_dist_wtd_comp_avg);

            const __m128i round_result_lo_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_lo_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_lo_1, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_0 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_0, &offset_const,
                                              &rounding_const, rounding_shift);
            const __m128i round_result_hi_1 =
                highbd_convolve_rounding_sse2(&comp_avg_res_hi_1, &offset_const,
                                              &rounding_const, rounding_shift);

            const __m128i res_16b_0 =
                _mm_packus_epi32(round_result_lo_0, round_result_hi_0);
            const __m128i res_clip_0 =
                _mm_min_epi16(res_16b_0, clip_pixel_to_bd);

            const __m128i res_16b_1 =
                _mm_packus_epi32(round_result_lo_1, round_result_hi_1);
            const __m128i res_clip_1 =
                _mm_min_epi16(res_16b_1, clip_pixel_to_bd);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]),
                            res_clip_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]),
                res_clip_1);
          } else {
            __m128i res_16bit0 =
                _mm_packus_epi32(res_unsigned_lo_0, res_unsigned_hi_0);
            __m128i res_16bit1 =
                _mm_packus_epi32(res_unsigned_lo_1, res_unsigned_hi_1);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_16bit0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_16bit1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];

        s[0 + 8] = s[1 + 8];
        s[1 + 8] = s[2 + 8];
        s[2 + 8] = s[3 + 8];

        s[4 + 8] = s[5 + 8];
        s[5 + 8] = s[6 + 8];
        s[6 + 8] = s[7 + 8];

        s6 = s8;
      }
    }
  }
}